

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_handler_NEXUS(project_monster_handler_context_t *context)

{
  uint32_t uVar1;
  wchar_t wVar2;
  
  project_monster_resist_other(context,L'X',L'\x03',true,MON_MSG_RESIST);
  uVar1 = Rand_div(3);
  if (uVar1 == 0) {
    wVar2 = L'\n';
  }
  else {
    uVar1 = Rand_div(4);
    if (uVar1 != 0) {
      return;
    }
    wVar2 = L'2';
  }
  context->teleport_distance = wVar2;
  return;
}

Assistant:

static void project_monster_handler_NEXUS(project_monster_handler_context_t *context)
{
	project_monster_resist_other(context, RF_IM_NEXUS, 3, true, MON_MSG_RESIST);

	if (one_in_(3)) {
		/* Blink */
		context->teleport_distance = 10;
	} else if (one_in_(4)) {
		/* Teleport */
		context->teleport_distance = 50;
	}
}